

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::isEnabled
          (FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *filters,MessageData *message)

{
  MessageFilter *pMVar1;
  bool bVar2;
  MessageFilter *pMVar3;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  const_reference local_38;
  MessageFilter *filter;
  size_t filterNdx;
  MessageData *pMStack_20;
  bool retval;
  MessageData *message_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *filters_local;
  FilterCase *this_local;
  
  filterNdx._7_1_ = 1;
  filter = (MessageFilter *)0x0;
  pMStack_20 = message;
  message_local = (MessageData *)filters;
  filters_local =
       (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
        *)this;
  do {
    pMVar1 = filter;
    pMVar3 = (MessageFilter *)
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)message_local);
    if (pMVar3 <= pMVar1) {
      return (bool)(filterNdx._7_1_ & 1);
    }
    local_38 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                             *)message_local,(size_type)filter);
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&local_38->ids);
    if (bVar2) {
      if ((((local_38->source == 0x1100) || (local_38->source == (pMStack_20->id).source)) &&
          ((local_38->type == 0x1100 || (local_38->type == (pMStack_20->id).type)))) &&
         ((local_38->severity == 0x1100 || (local_38->severity == pMStack_20->severity)))) {
LAB_006093ea:
        filterNdx._7_1_ = local_38->enabled & 1;
      }
    }
    else if ((local_38->source == (pMStack_20->id).source) &&
            (local_38->type == (pMStack_20->id).type)) {
      local_40._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&local_38->ids);
      local_48._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&local_38->ids);
      bVar2 = de::
              contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                        (&local_40,&local_48,&(pMStack_20->id).id);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_006093ea;
    }
    filter = (MessageFilter *)((long)&filter->source + 1);
  } while( true );
}

Assistant:

bool FilterCase::isEnabled (const vector<MessageFilter>& filters, const MessageData& message) const
{
	bool retval = true;

	for (size_t filterNdx = 0; filterNdx < filters.size(); filterNdx++)
	{
		const MessageFilter&	filter	= filters[filterNdx];

		if (filter.ids.empty())
		{
			if (filter.source != GL_DONT_CARE && filter.source != message.id.source)
				continue;

			if (filter.type != GL_DONT_CARE && filter.type != message.id.type)
				continue;

			if (filter.severity != GL_DONT_CARE && filter.severity != message.severity)
				continue;
		}
		else
		{
			DE_ASSERT(filter.source != GL_DONT_CARE);
			DE_ASSERT(filter.type != GL_DONT_CARE);
			DE_ASSERT(filter.severity == GL_DONT_CARE);

			if (filter.source != message.id.source || filter.type != message.id.type)
				continue;

			if (!de::contains(filter.ids.begin(), filter.ids.end(), message.id.id))
				continue;
		}

		retval = filter.enabled;
	}

	return retval;
}